

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

void xmlFreePatternList(xmlPatternPtr comp)

{
  _xmlPattern *p_Var1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  xmlStepOpPtr pxVar5;
  
  while (comp != (xmlPatternPtr)0x0) {
    p_Var1 = comp->next;
    comp->next = (_xmlPattern *)0x0;
    if (comp->stream != (xmlStreamCompPtr)0x0) {
      xmlFreeStreamComp(comp->stream);
    }
    if (comp->pattern != (xmlChar *)0x0) {
      (*xmlFree)(comp->pattern);
    }
    pxVar5 = comp->steps;
    if (pxVar5 != (xmlStepOpPtr)0x0) {
      if (comp->dict == (xmlDictPtr)0x0) {
        lVar3 = 0x10;
        for (lVar4 = 0; lVar4 < comp->nbStep; lVar4 = lVar4 + 1) {
          pvVar2 = *(void **)((long)pxVar5 + lVar3 + -8);
          if (pvVar2 != (void *)0x0) {
            (*xmlFree)(pvVar2);
          }
          pvVar2 = *(void **)((long)&pxVar5->op + lVar3);
          if (pvVar2 != (void *)0x0) {
            (*xmlFree)(pvVar2);
          }
          pxVar5 = comp->steps;
          lVar3 = lVar3 + 0x18;
        }
      }
      (*xmlFree)(pxVar5);
    }
    if (comp->dict != (xmlDictPtr)0x0) {
      xmlDictFree(comp->dict);
    }
    *(undefined4 *)&comp->steps = 0xffffffff;
    *(undefined4 *)((long)&comp->steps + 4) = 0xffffffff;
    *(undefined4 *)&comp->stream = 0xffffffff;
    *(undefined4 *)((long)&comp->stream + 4) = 0xffffffff;
    comp->flags = -1;
    comp->nbStep = -1;
    comp->maxStep = -1;
    *(undefined4 *)&comp->field_0x2c = 0xffffffff;
    *(undefined4 *)&comp->next = 0xffffffff;
    *(undefined4 *)((long)&comp->next + 4) = 0xffffffff;
    *(undefined4 *)&comp->pattern = 0xffffffff;
    *(undefined4 *)((long)&comp->pattern + 4) = 0xffffffff;
    *(undefined4 *)&comp->data = 0xffffffff;
    *(undefined4 *)((long)&comp->data + 4) = 0xffffffff;
    *(undefined4 *)&comp->dict = 0xffffffff;
    *(undefined4 *)((long)&comp->dict + 4) = 0xffffffff;
    (*xmlFree)(comp);
    comp = p_Var1;
  }
  return;
}

Assistant:

void
xmlFreePatternList(xmlPatternPtr comp) {
    xmlPatternPtr cur;

    while (comp != NULL) {
	cur = comp;
	comp = comp->next;
	cur->next = NULL;
	xmlFreePatternInternal(cur);
    }
}